

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O1

void __thiscall
pool_layer_t::pool_layer_t(pool_layer_t *this,uint16_t stride,uint16_t extend_filter,tdsize in_size)

{
  int iVar1;
  int _z;
  int _x;
  int _y;
  int iVar2;
  tensor_t<float> local_a8;
  tensor_t<float> local_80;
  tensor_t<float> local_58;
  
  _z = in_size.z;
  iVar2 = in_size.x;
  iVar1 = in_size.y;
  tensor_t<float>::tensor_t(&local_58,iVar2,iVar1,_z);
  tensor_t<float>::tensor_t(&local_80,iVar2,iVar1,_z);
  iVar2 = iVar2 - (uint)extend_filter;
  iVar1 = iVar1 - (uint)extend_filter;
  _x = iVar2 / (int)(uint)stride + 1;
  _y = iVar1 / (int)(uint)stride + 1;
  tensor_t<float>::tensor_t(&local_a8,_x,_y,_z);
  layer_t::layer_t(&this->super_layer_t,pool,&local_58,&local_80,&local_a8);
  if (local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->stride = stride;
  this->extend_filter = extend_filter;
  if ((float)iVar2 / (float)stride + 1.0 == (float)_x) {
    if ((float)iVar1 / (float)stride + 1.0 == (float)_y) {
      return;
    }
    __assert_fail("(float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/pool_layer_t.h"
                  ,0x1a,"pool_layer_t::pool_layer_t(uint16_t, uint16_t, tdsize)");
  }
  __assert_fail("(float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/pool_layer_t.h"
                ,0x18,"pool_layer_t::pool_layer_t(uint16_t, uint16_t, tdsize)");
}

Assistant:

pool_layer_t(uint16_t stride, uint16_t extend_filter, tdsize in_size)
      : layer_t(layer_type::pool,
                tensor_t<float>(in_size.x, in_size.y, in_size.z),
                tensor_t<float>(in_size.x, in_size.y, in_size.z),
                tensor_t<float>((in_size.x - extend_filter) / stride + 1,
                                (in_size.y - extend_filter) / stride + 1,
                                in_size.z)) {
    this->stride = stride;
    this->extend_filter = extend_filter;
    assert((float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1));

    assert((float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1));
  }